

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btDantzigLCP.cpp
# Opt level: O1

void btFactorLDLT(btScalar *A,btScalar *d,int n,int nskip1)

{
  long lVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  int iVar7;
  int iVar8;
  float *pfVar9;
  btScalar *pbVar10;
  long lVar11;
  long lVar12;
  float *pfVar13;
  int iVar14;
  ulong uVar15;
  btScalar *pbVar16;
  long lVar17;
  uint uVar18;
  long lVar19;
  ulong uVar20;
  int iVar21;
  long lVar22;
  btScalar *pbVar23;
  btScalar *pbVar24;
  long lVar25;
  btScalar *pbVar26;
  long lVar27;
  btScalar *pbVar28;
  long lVar29;
  ulong uVar30;
  btScalar *pbVar31;
  long lVar32;
  float *pfVar33;
  long lVar34;
  long lVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  float fVar48;
  float fVar49;
  float fVar50;
  float fVar51;
  float fVar52;
  float fVar53;
  float fVar54;
  float fVar55;
  float fVar56;
  float fVar57;
  long local_68;
  long local_60;
  long local_58;
  
  if (0 < n) {
    uVar20 = 0;
    if (n != 1) {
      lVar34 = (long)nskip1;
      lVar22 = (long)(nskip1 + 1);
      lVar1 = lVar34 * 8;
      pbVar24 = A + lVar34;
      pbVar23 = A + lVar22;
      pbVar26 = A + (nskip1 + 2);
      pbVar28 = A + (nskip1 + 3);
      pbVar16 = A + (nskip1 + 4);
      pbVar31 = A + (nskip1 + 5);
      iVar14 = 6;
      local_58 = 0;
      uVar20 = 0;
      pbVar10 = A;
      local_68 = lVar22 * 4;
      local_60 = lVar34 * 4;
      do {
        pfVar13 = A + uVar20 * lVar34;
        if (uVar20 != 0) {
          iVar21 = 2;
          lVar11 = 0;
          uVar15 = 0;
          lVar12 = lVar22 * 4;
          lVar27 = lVar34 * 4;
          do {
            if (uVar15 == 0) {
              lVar32 = 0;
              fVar38 = 0.0;
              fVar40 = 0.0;
              fVar41 = 0.0;
              fVar42 = 0.0;
              iVar8 = 0;
              pfVar9 = pfVar13;
            }
            else {
              fVar38 = 0.0;
              fVar40 = 0.0;
              fVar41 = 0.0;
              fVar42 = 0.0;
              lVar17 = local_68;
              lVar19 = local_60;
              lVar25 = local_58;
              lVar29 = lVar12;
              lVar32 = lVar11;
              lVar35 = lVar27;
              iVar7 = iVar21;
              do {
                iVar8 = iVar7;
                fVar2 = *(float *)((long)A + lVar25 + 4);
                fVar50 = *(float *)((long)A + lVar32 + 4);
                fVar38 = fVar2 * fVar50 +
                         *(float *)((long)A + lVar25) * *(float *)((long)A + lVar32) + fVar38;
                fVar40 = *(float *)((long)A + lVar17) * fVar50 +
                         *(float *)((long)A + lVar19) * *(float *)((long)A + lVar32) + fVar40;
                fVar41 = *(float *)((long)A + lVar29) * fVar2 +
                         *(float *)((long)A + lVar35) * *(float *)((long)A + lVar25) + fVar41;
                fVar42 = *(float *)((long)A + lVar29) * *(float *)((long)A + lVar17) +
                         *(float *)((long)A + lVar35) * *(float *)((long)A + lVar19) + fVar42;
                iVar7 = iVar8 + -2;
                lVar32 = lVar32 + 8;
                lVar29 = lVar29 + 8;
                lVar35 = lVar35 + 8;
                lVar25 = lVar25 + 8;
                lVar17 = lVar17 + 8;
                lVar19 = lVar19 + 8;
              } while (3 < iVar7);
              iVar8 = iVar8 + -4;
              pfVar9 = (float *)(lVar25 + (long)A);
            }
            pfVar33 = (float *)(lVar32 + (long)A);
            if (0 < iVar8) {
              iVar8 = iVar8 + 1;
              do {
                fVar38 = fVar38 + *pfVar9 * *pfVar33;
                fVar40 = fVar40 + pfVar9[lVar34] * *pfVar33;
                fVar41 = fVar41 + pfVar33[lVar34] * *pfVar9;
                fVar42 = fVar42 + pfVar33[lVar34] * pfVar9[lVar34];
                pfVar33 = pfVar33 + 1;
                pfVar9 = pfVar9 + 1;
                iVar8 = iVar8 + -1;
              } while (1 < iVar8);
            }
            fVar2 = *pfVar9;
            *pfVar9 = fVar2 - fVar38;
            fVar50 = pfVar9[lVar34];
            pfVar9[lVar34] = fVar50 - fVar40;
            fVar57 = pfVar33[lVar34];
            pfVar9[1] = (pfVar9[1] - fVar41) - (fVar2 - fVar38) * fVar57;
            pfVar9[lVar22] = (pfVar9[lVar22] - fVar42) - (fVar50 - fVar40) * fVar57;
            uVar15 = uVar15 + 2;
            iVar21 = iVar21 + 2;
            lVar11 = lVar11 + lVar1;
            lVar12 = lVar12 + lVar1;
            lVar27 = lVar27 + lVar1;
          } while (uVar15 < uVar20);
        }
        fVar38 = 0.0;
        fVar40 = 0.0;
        fVar41 = 0.0;
        if (uVar20 < 6) {
          iVar21 = (int)uVar20;
          pfVar9 = d;
        }
        else {
          lVar12 = 0;
          iVar8 = iVar14;
          do {
            iVar21 = iVar8;
            fVar42 = *(float *)((long)pbVar10 + lVar12);
            fVar2 = *(float *)((long)pbVar24 + lVar12);
            fVar44 = *(float *)((long)d + lVar12) * fVar42;
            fVar51 = *(float *)((long)d + lVar12) * fVar2;
            *(float *)((long)pbVar10 + lVar12) = fVar44;
            *(float *)((long)pbVar24 + lVar12) = fVar51;
            fVar50 = *(float *)((long)pbVar10 + lVar12 + 4);
            fVar57 = *(float *)((long)pbVar23 + lVar12);
            fVar52 = *(float *)((long)d + lVar12 + 4);
            fVar45 = fVar52 * fVar50;
            fVar52 = fVar52 * fVar57;
            *(float *)((long)pbVar10 + lVar12 + 4) = fVar45;
            *(float *)((long)pbVar23 + lVar12) = fVar52;
            fVar36 = *(float *)((long)pbVar10 + lVar12 + 8);
            fVar37 = *(float *)((long)pbVar26 + lVar12);
            fVar53 = *(float *)((long)d + lVar12 + 8);
            fVar46 = fVar53 * fVar36;
            fVar53 = fVar53 * fVar37;
            *(float *)((long)pbVar10 + lVar12 + 8) = fVar46;
            *(float *)((long)pbVar26 + lVar12) = fVar53;
            fVar39 = *(float *)((long)pbVar10 + lVar12 + 0xc);
            fVar43 = *(float *)((long)pbVar28 + lVar12);
            fVar54 = *(float *)((long)d + lVar12 + 0xc);
            fVar47 = fVar54 * fVar39;
            fVar54 = fVar54 * fVar43;
            *(float *)((long)pbVar10 + lVar12 + 0xc) = fVar47;
            *(float *)((long)pbVar28 + lVar12) = fVar54;
            fVar3 = *(float *)((long)pbVar10 + lVar12 + 0x10);
            fVar4 = *(float *)((long)pbVar16 + lVar12);
            fVar55 = *(float *)((long)d + lVar12 + 0x10);
            fVar48 = fVar55 * fVar3;
            fVar55 = fVar55 * fVar4;
            *(float *)((long)pbVar10 + lVar12 + 0x10) = fVar48;
            *(float *)((long)pbVar16 + lVar12) = fVar55;
            fVar5 = *(float *)((long)pbVar10 + lVar12 + 0x14);
            fVar6 = *(float *)((long)pbVar31 + lVar12);
            fVar56 = *(float *)((long)d + lVar12 + 0x14);
            fVar49 = fVar56 * fVar5;
            fVar56 = fVar56 * fVar6;
            *(float *)((long)pbVar10 + lVar12 + 0x14) = fVar49;
            *(float *)((long)pbVar31 + lVar12) = fVar56;
            fVar41 = fVar5 * fVar49 +
                     fVar3 * fVar48 +
                     fVar39 * fVar47 + fVar36 * fVar46 + fVar50 * fVar45 + fVar42 * fVar44 + fVar41;
            fVar38 = fVar6 * fVar49 +
                     fVar4 * fVar48 +
                     fVar43 * fVar47 + fVar37 * fVar46 + fVar57 * fVar45 + fVar2 * fVar44 + fVar38;
            fVar40 = fVar6 * fVar56 +
                     fVar4 * fVar55 +
                     fVar43 * fVar54 + fVar37 * fVar53 + fVar57 * fVar52 + fVar2 * fVar51 + fVar40;
            lVar12 = lVar12 + 0x18;
            iVar8 = iVar21 + -6;
          } while (0xb < iVar8);
          pfVar13 = (float *)(lVar12 + (long)pbVar10);
          iVar21 = iVar21 + -0xc;
          pfVar9 = (float *)((long)d + lVar12);
        }
        if (0 < iVar21) {
          iVar21 = iVar21 + 1;
          do {
            fVar42 = *pfVar13;
            fVar2 = pfVar13[lVar34];
            fVar50 = *pfVar9 * fVar42;
            fVar57 = *pfVar9 * fVar2;
            *pfVar13 = fVar50;
            pfVar13[lVar34] = fVar57;
            fVar41 = fVar41 + fVar42 * fVar50;
            fVar38 = fVar38 + fVar2 * fVar50;
            fVar40 = fVar40 + fVar2 * fVar57;
            pfVar13 = pfVar13 + 1;
            pfVar9 = pfVar9 + 1;
            iVar21 = iVar21 + -1;
          } while (1 < iVar21);
        }
        fVar42 = pfVar13[lVar34];
        fVar2 = pfVar13[lVar22];
        fVar41 = 1.0 / (*pfVar13 - fVar41);
        d[uVar20] = fVar41;
        fVar41 = fVar41 * (fVar42 - fVar38);
        d[uVar20 + 1] = 1.0 / ((fVar2 - fVar40) - ((fVar42 - fVar38) * fVar41 + 0.0));
        pfVar13[lVar34] = fVar41;
        uVar20 = uVar20 + 2;
        local_58 = local_58 + lVar1;
        local_68 = local_68 + lVar1;
        local_60 = local_60 + lVar1;
        pbVar24 = pbVar24 + lVar34 * 2;
        pbVar23 = pbVar23 + lVar34 * 2;
        pbVar26 = pbVar26 + lVar34 * 2;
        pbVar28 = pbVar28 + lVar34 * 2;
        pbVar16 = pbVar16 + lVar34 * 2;
        pbVar31 = pbVar31 + lVar34 * 2;
        pbVar10 = pbVar10 + lVar34 * 2;
        iVar14 = iVar14 + 2;
      } while ((long)uVar20 <= (long)(n + -2));
    }
    uVar18 = (uint)uVar20;
    if (n - uVar18 == 1) {
      pfVar13 = A + (int)(uVar18 * nskip1);
      uVar15 = uVar20 & 0xffffffff;
      if (uVar18 != 0) {
        lVar12 = (long)nskip1;
        lVar1 = lVar12 * 8;
        lVar34 = (long)(nskip1 + 1) << 2;
        lVar22 = lVar12 * 4;
        iVar14 = 2;
        lVar27 = 0;
        uVar30 = 0;
        do {
          if (uVar30 == 0) {
            lVar11 = 0;
            fVar38 = 0.0;
            fVar40 = 0.0;
            iVar21 = 0;
            pfVar9 = pfVar13;
          }
          else {
            fVar38 = 0.0;
            fVar40 = 0.0;
            lVar11 = lVar27;
            lVar32 = lVar22;
            lVar17 = lVar34;
            lVar19 = (long)(int)(uVar18 * nskip1) << 2;
            iVar8 = iVar14;
            do {
              iVar21 = iVar8;
              fVar41 = *(float *)((long)A + lVar19 + 4);
              fVar38 = *(float *)((long)A + lVar11 + 4) * fVar41 +
                       *(float *)((long)A + lVar11) * *(float *)((long)A + lVar19) + fVar38;
              fVar40 = *(float *)((long)A + lVar17) * fVar41 +
                       *(float *)((long)A + lVar32) * *(float *)((long)A + lVar19) + fVar40;
              iVar8 = iVar21 + -2;
              lVar11 = lVar11 + 8;
              lVar17 = lVar17 + 8;
              lVar32 = lVar32 + 8;
              lVar19 = lVar19 + 8;
            } while (3 < iVar8);
            iVar21 = iVar21 + -4;
            pfVar9 = (float *)(lVar19 + (long)A);
          }
          pfVar33 = (float *)(lVar11 + (long)A);
          if (0 < iVar21) {
            iVar21 = iVar21 + 1;
            do {
              fVar38 = fVar38 + *pfVar33 * *pfVar9;
              fVar40 = fVar40 + pfVar33[lVar12] * *pfVar9;
              pfVar33 = pfVar33 + 1;
              pfVar9 = pfVar9 + 1;
              iVar21 = iVar21 + -1;
            } while (1 < iVar21);
          }
          fVar41 = *pfVar9;
          *pfVar9 = fVar41 - fVar38;
          pfVar9[1] = (pfVar9[1] - fVar40) - (fVar41 - fVar38) * pfVar33[lVar12];
          uVar30 = uVar30 + 2;
          iVar14 = iVar14 + 2;
          lVar27 = lVar27 + lVar1;
          lVar34 = lVar34 + lVar1;
          lVar22 = lVar22 + lVar1;
        } while (uVar30 < uVar15);
      }
      fVar38 = 0.0;
      pfVar9 = d;
      if (5 < (int)uVar18) {
        do {
          iVar14 = (int)uVar20;
          uVar18 = iVar14 - 6;
          fVar40 = *pfVar13;
          fVar41 = pfVar13[1];
          fVar43 = *pfVar9 * fVar40;
          *pfVar13 = fVar43;
          fVar52 = pfVar9[1] * fVar41;
          pfVar13[1] = fVar52;
          fVar42 = pfVar13[2];
          fVar53 = pfVar9[2] * fVar42;
          pfVar13[2] = fVar53;
          fVar2 = pfVar13[3];
          fVar37 = pfVar9[3] * fVar2;
          pfVar13[3] = fVar37;
          fVar50 = pfVar13[4];
          fVar39 = pfVar9[4] * fVar50;
          pfVar13[4] = fVar39;
          fVar57 = pfVar13[5];
          fVar36 = pfVar9[5] * fVar57;
          pfVar13[5] = fVar36;
          fVar38 = fVar36 * fVar57 +
                   fVar39 * fVar50 +
                   fVar37 * fVar2 + fVar53 * fVar42 + fVar52 * fVar41 + fVar43 * fVar40 + fVar38;
          pfVar13 = pfVar13 + 6;
          pfVar9 = pfVar9 + 6;
          uVar20 = (ulong)uVar18;
        } while (0xb < iVar14);
      }
      if (0 < (int)uVar18) {
        iVar14 = uVar18 + 1;
        do {
          fVar40 = *pfVar13;
          fVar41 = *pfVar9 * fVar40;
          *pfVar13 = fVar41;
          fVar38 = fVar38 + fVar41 * fVar40;
          pfVar13 = pfVar13 + 1;
          pfVar9 = pfVar9 + 1;
          iVar14 = iVar14 + -1;
        } while (1 < iVar14);
      }
      d[uVar15] = 1.0 / (*pfVar13 - fVar38);
    }
  }
  return;
}

Assistant:

void btFactorLDLT (btScalar *A, btScalar *d, int n, int nskip1)
{  
  int i,j;
  btScalar sum,*ell,*dee,dd,p1,p2,q1,q2,Z11,m11,Z21,m21,Z22,m22;
  if (n < 1) return;
  
  for (i=0; i<=n-2; i += 2) {
    /* solve L*(D*l)=a, l is scaled elements in 2 x i block at A(i,0) */
    btSolveL1_2 (A,A+i*nskip1,i,nskip1);
    /* scale the elements in a 2 x i block at A(i,0), and also */
    /* compute Z = the outer product matrix that we'll need. */
    Z11 = 0;
    Z21 = 0;
    Z22 = 0;
    ell = A+i*nskip1;
    dee = d;
    for (j=i-6; j >= 0; j -= 6) {
      p1 = ell[0];
      p2 = ell[nskip1];
      dd = dee[0];
      q1 = p1*dd;
      q2 = p2*dd;
      ell[0] = q1;
      ell[nskip1] = q2;
      m11 = p1*q1;
      m21 = p2*q1;
      m22 = p2*q2;
      Z11 += m11;
      Z21 += m21;
      Z22 += m22;
      p1 = ell[1];
      p2 = ell[1+nskip1];
      dd = dee[1];
      q1 = p1*dd;
      q2 = p2*dd;
      ell[1] = q1;
      ell[1+nskip1] = q2;
      m11 = p1*q1;
      m21 = p2*q1;
      m22 = p2*q2;
      Z11 += m11;
      Z21 += m21;
      Z22 += m22;
      p1 = ell[2];
      p2 = ell[2+nskip1];
      dd = dee[2];
      q1 = p1*dd;
      q2 = p2*dd;
      ell[2] = q1;
      ell[2+nskip1] = q2;
      m11 = p1*q1;
      m21 = p2*q1;
      m22 = p2*q2;
      Z11 += m11;
      Z21 += m21;
      Z22 += m22;
      p1 = ell[3];
      p2 = ell[3+nskip1];
      dd = dee[3];
      q1 = p1*dd;
      q2 = p2*dd;
      ell[3] = q1;
      ell[3+nskip1] = q2;
      m11 = p1*q1;
      m21 = p2*q1;
      m22 = p2*q2;
      Z11 += m11;
      Z21 += m21;
      Z22 += m22;
      p1 = ell[4];
      p2 = ell[4+nskip1];
      dd = dee[4];
      q1 = p1*dd;
      q2 = p2*dd;
      ell[4] = q1;
      ell[4+nskip1] = q2;
      m11 = p1*q1;
      m21 = p2*q1;
      m22 = p2*q2;
      Z11 += m11;
      Z21 += m21;
      Z22 += m22;
      p1 = ell[5];
      p2 = ell[5+nskip1];
      dd = dee[5];
      q1 = p1*dd;
      q2 = p2*dd;
      ell[5] = q1;
      ell[5+nskip1] = q2;
      m11 = p1*q1;
      m21 = p2*q1;
      m22 = p2*q2;
      Z11 += m11;
      Z21 += m21;
      Z22 += m22;
      ell += 6;
      dee += 6;
    }
    /* compute left-over iterations */
    j += 6;
    for (; j > 0; j--) {
      p1 = ell[0];
      p2 = ell[nskip1];
      dd = dee[0];
      q1 = p1*dd;
      q2 = p2*dd;
      ell[0] = q1;
      ell[nskip1] = q2;
      m11 = p1*q1;
      m21 = p2*q1;
      m22 = p2*q2;
      Z11 += m11;
      Z21 += m21;
      Z22 += m22;
      ell++;
      dee++;
    }
    /* solve for diagonal 2 x 2 block at A(i,i) */
    Z11 = ell[0] - Z11;
    Z21 = ell[nskip1] - Z21;
    Z22 = ell[1+nskip1] - Z22;
    dee = d + i;
    /* factorize 2 x 2 block Z,dee */
    /* factorize row 1 */
    dee[0] = btRecip(Z11);
    /* factorize row 2 */
    sum = 0;
    q1 = Z21;
    q2 = q1 * dee[0];
    Z21 = q2;
    sum += q1*q2;
    dee[1] = btRecip(Z22 - sum);
    /* done factorizing 2 x 2 block */
    ell[nskip1] = Z21;
  }
  /* compute the (less than 2) rows at the bottom */
  switch (n-i) {
    case 0:
    break;
    
    case 1:
    btSolveL1_1 (A,A+i*nskip1,i,nskip1);
    /* scale the elements in a 1 x i block at A(i,0), and also */
    /* compute Z = the outer product matrix that we'll need. */
    Z11 = 0;
    ell = A+i*nskip1;
    dee = d;
    for (j=i-6; j >= 0; j -= 6) {
      p1 = ell[0];
      dd = dee[0];
      q1 = p1*dd;
      ell[0] = q1;
      m11 = p1*q1;
      Z11 += m11;
      p1 = ell[1];
      dd = dee[1];
      q1 = p1*dd;
      ell[1] = q1;
      m11 = p1*q1;
      Z11 += m11;
      p1 = ell[2];
      dd = dee[2];
      q1 = p1*dd;
      ell[2] = q1;
      m11 = p1*q1;
      Z11 += m11;
      p1 = ell[3];
      dd = dee[3];
      q1 = p1*dd;
      ell[3] = q1;
      m11 = p1*q1;
      Z11 += m11;
      p1 = ell[4];
      dd = dee[4];
      q1 = p1*dd;
      ell[4] = q1;
      m11 = p1*q1;
      Z11 += m11;
      p1 = ell[5];
      dd = dee[5];
      q1 = p1*dd;
      ell[5] = q1;
      m11 = p1*q1;
      Z11 += m11;
      ell += 6;
      dee += 6;
    }
    /* compute left-over iterations */
    j += 6;
    for (; j > 0; j--) {
      p1 = ell[0];
      dd = dee[0];
      q1 = p1*dd;
      ell[0] = q1;
      m11 = p1*q1;
      Z11 += m11;
      ell++;
      dee++;
    }
    /* solve for diagonal 1 x 1 block at A(i,i) */
    Z11 = ell[0] - Z11;
    dee = d + i;
    /* factorize 1 x 1 block Z,dee */
    /* factorize row 1 */
    dee[0] = btRecip(Z11);
    /* done factorizing 1 x 1 block */
    break;
    
    //default: *((char*)0)=0;  /* this should never happen! */
  }
}